

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<const_void_*,_(anonymous_namespace)::Data> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert
          (Bucket *this)

{
  byte bVar1;
  Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *this_00;
  size_t sVar2;
  
  this_00 = this->span;
  sVar2 = this->index;
  if (this_00->nextFree == this_00->allocated) {
    Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::addStorage(this_00);
  }
  bVar1 = this_00->nextFree;
  this_00->nextFree = this_00->entries[bVar1].storage.data[0];
  this_00->offsets[sVar2] = bVar1;
  return (Node<const_void_*,_(anonymous_namespace)::Data> *)(this_00->entries + bVar1);
}

Assistant:

Node *insert() const
        {
            return span->insert(index);
        }